

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void __thiscall ChatClient::incomingData(ChatClient *this,Stream *stream)

{
  Stream *pSVar1;
  string line;
  string local_30;
  
  pSVar1 = this->inputStream;
  if (pSVar1 == (Stream *)0x0) {
    __assert_fail("inputStream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/chat.cpp"
                  ,0x62,"virtual void ChatClient::incomingData(Stream *)");
  }
  if (this->remoteStream != (Stream *)0x0) {
    if (pSVar1 == stream) {
      readLine_abi_cxx11_(&local_30,pSVar1);
      pSVar1 = this->remoteStream;
      (**(code **)(*(long *)pSVar1 + 0x10))
                (pSVar1,local_30._M_dataplus._M_p,local_30._M_string_length);
      (**(code **)(*(long *)pSVar1 + 0x18))(pSVar1);
    }
    else {
      readLine_abi_cxx11_(&local_30,this->remoteStream);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("remoteStream",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/chat.cpp"
                ,99,"virtual void ChatClient::incomingData(Stream *)");
}

Assistant:

void incomingData(Stream* stream)
	{
		assert(inputStream);
		assert(remoteStream);

		if (stream == inputStream)
		{
			string line = readLine(inputStream);
			sendString(remoteStream, line);
		}
		else
		{
			string line = readLine(remoteStream);
			cout << line;
			cout.flush();
		}
	}